

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_mbe.cpp
# Opt level: O3

void __thiscall
DSDcc::DSDMBEDecoder::processData(DSDMBEDecoder *this,char *imbe_data,char *ambe_data)

{
  return;
}

Assistant:

void DSDMBEDecoder::processData(char imbe_data[88], char ambe_data[49])
{
    if (!m_dsdDecoder->m_mbelibEnable) {
        return;
    }
#ifdef DSD_USE_MBELIB
    if (m_dsdDecoder->m_mbeRate == DSDDecoder::DSDMBERate4400)
    {
        mbe_processImbe4400Dataf(m_audio_out_temp_buf, &m_errs,
                &m_errs2, m_err_str, imbe_data, m_mbelibParms->m_cur_mp,
                m_mbelibParms->m_prev_mp, m_mbelibParms->m_prev_mp_enhanced, m_dsdDecoder->m_opts.uvquality);
    }
    else if (m_dsdDecoder->m_mbeRate == DSDDecoder::DSDMBERate2400)
    {
        mbe_processAmbe2400Dataf(m_audio_out_temp_buf, &m_errs,
                &m_errs2, m_err_str, ambe_data, m_mbelibParms->m_cur_mp,
                m_mbelibParms->m_prev_mp, m_mbelibParms->m_prev_mp_enhanced, m_dsdDecoder->m_opts.uvquality);
    }
    else if (m_dsdDecoder->m_mbeRate == DSDDecoder::DSDMBERate2450)
    {
        mbe_processAmbe2450Dataf(m_audio_out_temp_buf, &m_errs,
                &m_errs2, m_err_str, ambe_data, m_mbelibParms->m_cur_mp,
                m_mbelibParms->m_prev_mp, m_mbelibParms->m_prev_mp_enhanced, m_dsdDecoder->m_opts.uvquality);
    }
    else
    {
        return;
    }

    if (m_dsdDecoder->m_opts.errorbars == 1)
    {
        m_dsdDecoder->getLogger().log("%s", m_err_str);
    }

    processAudio();
#endif
}